

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

bool __thiscall
CPubKey::Verify(CPubKey *this,uint256 *hash,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig)

{
  byte bVar1;
  uchar *input;
  int iVar2;
  size_t inputlen;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  secp256k1_ecdsa_signature local_a0;
  secp256k1_pubkey local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    inputlen = 0x21;
  }
  else {
    bVar4 = false;
    if ((7 < bVar1) || (uVar3 = (uint)bVar1, (0xd0U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_0082303d;
    if ((7 < uVar3) || (inputlen = 0x41, (0xd0U >> (uVar3 & 0x1f) & 1) == 0)) {
      inputlen = 0;
    }
  }
  iVar2 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&local_60,this->vch,inputlen);
  if (iVar2 != 0) {
    input = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    iVar2 = ecdsa_signature_parse_der_lax
                      (&local_a0,input,
                       (long)(vchSig->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)input);
    if (iVar2 != 0) {
      secp256k1_ecdsa_signature_normalize(secp256k1_context_static,&local_a0,&local_a0);
      iVar2 = secp256k1_ecdsa_verify(secp256k1_context_static,&local_a0,(uchar *)hash,&local_60);
      bVar4 = iVar2 != 0;
      goto LAB_0082303d;
    }
  }
  bVar4 = false;
LAB_0082303d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Verify(const uint256 &hash, const std::vector<unsigned char>& vchSig) const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!ecdsa_signature_parse_der_lax(&sig, vchSig.data(), vchSig.size())) {
        return false;
    }
    /* libsecp256k1's ECDSA verification requires lower-S signatures, which have
     * not historically been enforced in Bitcoin, so normalize them first. */
    secp256k1_ecdsa_signature_normalize(secp256k1_context_static, &sig, &sig);
    return secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pubkey);
}